

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletdb.cpp
# Opt level: O0

bool wallet::LoadHDChain(CWallet *pwallet,DataStream *ssValue,string *strErr)

{
  long lVar1;
  LegacyDataSPKM *this;
  AnnotatedMixin<std::recursive_mutex> *in_RDX;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *in_RSI;
  long in_FS_OFFSET;
  exception *e;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock4;
  CHDChain chain;
  CHDChain *in_stack_ffffffffffffff58;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff67;
  CWallet *in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff7b;
  int in_stack_ffffffffffffff7c;
  char *in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff88;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffff58);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (in_RSI,in_RDX,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
             in_stack_ffffffffffffff7c,(bool)in_stack_ffffffffffffff7b);
  CHDChain::CHDChain(in_stack_ffffffffffffff58);
  DataStream::operator>>
            ((DataStream *)in_stack_ffffffffffffff68,
             (CHDChain *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
  this = CWallet::GetOrCreateLegacyDataSPKM(in_stack_ffffffffffffff68);
  LegacyDataSPKM::LoadHDChain
            (this,(CHDChain *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffff58);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return true;
  }
  __stack_chk_fail();
}

Assistant:

bool LoadHDChain(CWallet* pwallet, DataStream& ssValue, std::string& strErr)
{
    LOCK(pwallet->cs_wallet);
    try {
        CHDChain chain;
        ssValue >> chain;
        pwallet->GetOrCreateLegacyDataSPKM()->LoadHDChain(chain);
    } catch (const std::exception& e) {
        if (strErr.empty()) {
            strErr = e.what();
        }
        return false;
    }
    return true;
}